

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O3

void __thiscall VulkanUtilities::VulkanCommandBuffer::NextSubpass(VulkanCommandBuffer *this)

{
  char (*in_RCX) [32];
  VkCommandBuffer pVVar1;
  string msg;
  string local_30;
  
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    Diligent::FormatString<char[33]>(&local_30,(char (*) [33])"Render pass has not been started");
    in_RCX = (char (*) [32])0x160;
    Diligent::DebugAssertionFailed
              (local_30._M_dataplus._M_p,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  pVVar1 = this->m_VkCmdBuffer;
  if (pVVar1 == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (local_30._M_dataplus._M_p,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x161);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pVVar1 = this->m_VkCmdBuffer;
  }
  (*vkCmdNextSubpass)(pVVar1,VK_SUBPASS_CONTENTS_INLINE);
  return;
}

Assistant:

__forceinline void NextSubpass()
    {
        VERIFY(m_State.RenderPass != VK_NULL_HANDLE, "Render pass has not been started");
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdNextSubpass(m_VkCmdBuffer, VK_SUBPASS_CONTENTS_INLINE);
    }